

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

PRECandidates * __thiscall
GlobOpt::FindBackEdgePRECandidates(GlobOpt *this,BasicBlock *block,JitArenaAllocator *alloc)

{
  SymID *key;
  ValueHashTable<Sym_*,_Value_*> *this_00;
  Sym *this_01;
  code *pcVar1;
  PRECandidates *pPVar2;
  bool bVar3;
  BOOLEAN BVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  PropertySym *sym;
  StackSym *pSVar7;
  BasicBlock *pBVar8;
  Value **ppVVar9;
  Value *pVVar10;
  Instr **ppIVar11;
  PRECandidatesList *pPVar12;
  BVSparse<Memory::JitArenaAllocator> *pBVar13;
  ulong uVar14;
  Iterator local_58;
  Instr *local_48;
  Loop *local_40;
  PRECandidates *local_38;
  
  local_40 = block->loop;
  this_00 = (block->globOptData).symToValueMap;
  uVar14 = 0;
  local_38 = (PRECandidates *)new<Memory::JitArenaAllocator>(0x18,this->tempAlloc,0x3d6ef4);
  local_38->candidatesToProcess = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  local_38->candidatesBv = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  local_38->candidatesList = (PRECandidatesList *)0x0;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    if (this_00->tableSize <= uVar14) {
      return local_38;
    }
    local_58.list = this_00->table + uVar14;
    local_58.current = &(local_58.list)->super_SListNodeBase<Memory::ArenaAllocator>;
LAB_00401900:
    if ((SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_58.current
        == (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    local_58.current =
         (((SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
          local_58.current)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_58.current
        != local_58.list) {
      pIVar6 = (Instr *)SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                        Iterator::Data(&local_58);
      if ((*(Sym **)&pIVar6->m_noLazyHelperAssert)->m_kind == SymKindProperty) {
        sym = Sym::AsPropertySym(*(Sym **)&pIVar6->m_noLazyHelperAssert);
        BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((block->globOptData).liveFields,(sym->super_Sym).m_id);
        if (BVar4 != '\0') {
          key = &(sym->super_Sym).m_id;
          BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                            ((local_40->landingPad->globOptData).liveFields,*key);
          if (BVar4 != '\0') {
            pVVar10 = (Value *)pIVar6->_vptr_Instr;
            this_01 = pVVar10->valueInfo->symStore;
            if ((this_01 != (Sym *)0x0) && (this_01->m_kind == SymKindStack)) {
              pSVar7 = Sym::AsStackSym(this_01);
              if (((pSVar7->field_0x18 & 1) == 0) || ((pSVar7->field_5).m_instrDef == (Instr *)0x0))
              {
LAB_00401a12:
                ppVVar9 = ValueHashTable<Sym_*,_Value_*>::Get(this_00,this_01->m_id);
                if ((ppVVar9 == (Value **)0x0) || ((*ppVVar9)->valueNumber != pVVar10->valueNumber))
                goto LAB_00401900;
              }
              else {
                pBVar8 = Loop::GetHeadBlock(local_40);
                BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                                  (pBVar8->upwardExposedUses,this_01->m_id);
                if (BVar4 != '\0') goto LAB_00401a12;
              }
              pVVar10 = GlobOptBlockData::FindValue
                                  (&local_40->landingPad->globOptData,&sym->super_Sym);
              if (pVVar10 != (Value *)0x0) {
                local_48 = (Instr *)0x0;
                ppIVar11 = JsUtil::
                           BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                           ::LookupWithKey<unsigned_int>(this->prePassInstrMap,key,&local_48);
                if (*ppIVar11 != (Instr *)0x0) {
                  pPVar12 = local_38->candidatesList;
                  if (pPVar12 == (PRECandidatesList *)0x0) {
                    pPVar12 = (PRECandidatesList *)
                              new<Memory::JitArenaAllocator>(0x18,alloc,0x3d6ef4);
                    (pPVar12->
                    super_SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>
                    ).super_SListNodeBase<Memory::JitArenaAllocator>.next = (Type)pPVar12;
                    (pPVar12->
                    super_SListBase<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>
                    ).super_RealCount.count = 0;
                    pPVar12->allocator = alloc;
                    local_38->candidatesList = pPVar12;
                    pBVar13 = (BVSparse<Memory::JitArenaAllocator> *)
                              new<Memory::JitArenaAllocator>(0x20,alloc,0x3d6ef4);
                    pBVar13->head = (Type_conflict)0x0;
                    pBVar13->lastFoundIndex = (Type_conflict)0x0;
                    pBVar13->alloc = alloc;
                    pBVar13->lastUsedNodePrevNextField = (Type)pBVar13;
                    local_38->candidatesToProcess = pBVar13;
                    pBVar13 = (BVSparse<Memory::JitArenaAllocator> *)
                              new<Memory::JitArenaAllocator>(0x20,alloc,0x3d6ef4);
                    pBVar13->head = (Type_conflict)0x0;
                    pBVar13->lastFoundIndex = (Type_conflict)0x0;
                    pBVar13->alloc = alloc;
                    pBVar13->lastUsedNodePrevNextField = (Type)pBVar13;
                    local_38->candidatesBv = pBVar13;
                    pPVar12 = local_38->candidatesList;
                  }
                  pPVar2 = local_38;
                  local_48 = pIVar6;
                  SList<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::Prepend
                            (pPVar12,(HashBucket<Sym_*,_Value_*> **)&local_48);
                  BVSparse<Memory::JitArenaAllocator>::Set(pPVar2->candidatesToProcess,*key);
                  BVSparse<Memory::JitArenaAllocator>::Set(pPVar2->candidatesBv,*key);
                }
              }
            }
          }
        }
      }
      goto LAB_00401900;
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

PRECandidates * GlobOpt::FindBackEdgePRECandidates(BasicBlock *block, JitArenaAllocator *alloc)
{
    // Iterate over the value table looking for propertySyms which are candidates to
    // pre-load in the landing pad for field PRE

    GlobHashTable *valueTable = block->globOptData.symToValueMap;
    Loop *loop = block->loop;
    PRECandidates *candidates = JitAnew(this->tempAlloc, PRECandidates);

    for (uint i = 0; i < valueTable->tableSize; i++)
    {
        FOREACH_SLISTBASE_ENTRY(GlobHashBucket, bucket, &valueTable->table[i])
        {
            Sym *sym = bucket.value;

            if (!sym->IsPropertySym())
            {
                continue;
            }

            PropertySym *propertySym = sym->AsPropertySym();

            // Field should be live on the back-edge
            if (!block->globOptData.liveFields->Test(propertySym->m_id))
            {
                continue;
            }

            // Field should be live in the landing pad as well
            if (!loop->landingPad->globOptData.liveFields->Test(propertySym->m_id))
            {
                continue;
            }

            Value *value = bucket.element;
            Sym *symStore = value->GetValueInfo()->GetSymStore();

            if (!symStore || !symStore->IsStackSym())
            {
                continue;
            }

            // Check upwardExposed in case of:
            //  s1 = 0;
            // loop:
            //        = o.x;
            //        foo();
            //    o.x = s1;
            // Can't thrash s1 in loop top.
            if (!symStore->AsStackSym()->IsSingleDef() || loop->GetHeadBlock()->upwardExposedUses->Test(symStore->m_id))
            {
                // If symStore isn't singleDef, we need to make sure it still has the same value.
                // This usually fails if we are not aggressive at transferring values in the prepass.
                Value **pSymStoreFromValue = valueTable->Get(symStore->m_id);

                // Consider: We should be fine if symStore isn't live in landing pad...
                if (!pSymStoreFromValue || (*pSymStoreFromValue)->GetValueNumber() != value->GetValueNumber())
                {
                    continue;
                }
            }

            BasicBlock *landingPad = loop->landingPad;
            Value *landingPadValue = landingPad->globOptData.FindValue(propertySym);

            if (!landingPadValue)
            {
                // Value should be added as initial value or already be there.
                continue;
            }

            IR::Instr * ldInstr = this->prePassInstrMap->Lookup(propertySym->m_id, nullptr);

            if (!ldInstr)
            {
                continue;
            }

            if (!candidates->candidatesList)
            {
                candidates->candidatesList = JitAnew(alloc, PRECandidatesList, alloc);
                candidates->candidatesToProcess = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
                candidates->candidatesBv = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
            }

            candidates->candidatesList->Prepend(&bucket);
            candidates->candidatesToProcess->Set(propertySym->m_id);
            candidates->candidatesBv->Set(propertySym->m_id);

        } NEXT_SLISTBASE_ENTRY;
    }

    return candidates;
}